

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.h
# Opt level: O0

string * __thiscall
RelPathEnv::ApplyChdir(string *__return_storage_ptr__,RelPathEnv *this,string *s)

{
  uint uVar1;
  long lVar2;
  char *pcVar3;
  string *psVar4;
  ulong uVar5;
  bool bVar6;
  size_type i;
  undefined1 local_40 [8];
  string a;
  string *s_local;
  RelPathEnv *this_local;
  
  a.field_2._8_8_ = s;
  lVar2 = std::__cxx11::string::size();
  if ((lVar2 == 0) || (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar3 != '/'))
  {
    psVar4 = AsString_abi_cxx11_(this);
    std::__cxx11::string::string((string *)local_40,(string *)psVar4);
    while( true ) {
      uVar1 = std::__cxx11::string::empty();
      bVar6 = false;
      if ((uVar1 & 1) == 0) {
        uVar5 = std::__cxx11::string::size();
        bVar6 = false;
        if (3 < uVar5) {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
          bVar6 = *pcVar3 == '.';
        }
      }
      if (!bVar6) break;
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
      if (*pcVar3 == '/') {
        std::__cxx11::string::erase((ulong)s,0);
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
        if ((*pcVar3 == '.') &&
           (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar3 == '/')) {
          std::__cxx11::string::size();
          lVar2 = std::__cxx11::string::rfind((char)local_40,0x2f);
          if (lVar2 == -1) {
            std::__cxx11::string::clear();
          }
          else {
            std::__cxx11::string::size();
            std::__cxx11::string::erase((ulong)local_40,lVar2 + 1);
          }
          std::__cxx11::string::erase((ulong)s,0);
        }
      }
    }
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,s);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  return __return_storage_ptr__;
}

Assistant:

string ApplyChdir(string s) const {
    if (s.size() > 0 && s[0] == '/') {
      return s;
    }
    // Optimization: only simplify ./ and ../ on boundary between a and s.
    // To process all ./ and ../, wrap the following code in a loop. At the end
    // of the loop, search for ./ or ../ and construct new a and s using that as
    // the new boundary.
    //
    // Note: there are dangerous filesystem bugs in assuming that ../ can be
    // simplified in this way. It only "works" when the dir before ../ in the
    // relative path is a physical directory entry (so, no symlinks, FS joins,
    // or other filesystem features).
    string a = AsString();
    while (!a.empty() && s.size() > 3 &&
        s[0] == '.') {
      if (s[1] == '/') {
        s.erase(0, 2);  // Remove "./" from s.
      } else if (s[1] == '.' && s[2] == '/') {
        string::size_type i = a.rfind('/', a.size() - 2);
        if (i == string::npos) {
          a.clear();
        } else {
          i++;
          a.erase(i, a.size() - i);  // Remove "../" from s and one dir from a.
        }
        s.erase(0, 3);
      }
    }
    return a + s;
  }